

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O2

void __thiscall mg::data::Mzp::MzpArchiveEntry::print(MzpArchiveEntry *this)

{
  fprintf(_stderr,
          "MzpArchiveEntry:\n    Sector offset:   %08x\n    Byte offset:     %08x\n    Size sectors:    %08x\n    Size lowbytes:   %08x\n    True offset:     %08x\n    True size:       %08x\n"
         );
  return;
}

Assistant:

void Mzp::MzpArchiveEntry::print() {
  fprintf(stderr,
          "MzpArchiveEntry:\n"
          "    Sector offset:   %08x\n"
          "    Byte offset:     %08x\n"
          "    Size sectors:    %08x\n"
          "    Size lowbytes:   %08x\n"
          "    True offset:     %08x\n"
          "    True size:       %08x\n",
          sector_offset, byte_offset, size_sectors, size_bytes,
          (sector_offset * SECTOR_SIZE) + byte_offset, entry_data_size());
}